

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QAccessibleInterface *iface)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  QDebug *this;
  QDebug *this_00;
  long lVar4;
  QDebug *o;
  undefined8 uVar5;
  QDebug *pQVar6;
  long *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QStringList stateStrings;
  QDebugStateSaver saver;
  State st;
  undefined4 in_stack_fffffffffffffea8;
  Role in_stack_fffffffffffffeac;
  QList<QString> *in_stack_fffffffffffffeb0;
  QListSpecialMethods<QString> *in_stack_fffffffffffffeb8;
  QDebug *in_stack_fffffffffffffec8;
  QDebug local_e8;
  QDebug local_e0;
  QChar local_d2 [61];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QDebug local_40;
  QDebug local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  QList<QString> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_18,in_RSI);
  if (in_RDX == (long *)0x0) {
    QDebug::operator<<(in_stack_fffffffffffffec8,(char *)pQVar6);
    QDebug::QDebug((QDebug *)in_stack_fffffffffffffeb0,
                   (QDebug *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_stack_fffffffffffffec8,(char *)pQVar6);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                       (QTextStreamFunction)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                       (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                       (QTextStreamFunction)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    uVar3 = (**(code **)(*in_RDX + 0x10))();
    if ((uVar3 & 1) == 0) {
      QDebug::operator<<(in_stack_fffffffffffffec8,(char *)pQVar6);
    }
    else {
      this = QDebug::operator<<(in_stack_fffffffffffffec8,(char *)pQVar6);
      (**(code **)(*in_RDX + 0x60))(local_30,in_RDX,0);
      QDebug::operator<<(this,(QString *)in_stack_fffffffffffffeb8);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                         (char)(in_stack_fffffffffffffeac >> 0x18));
      QString::~QString((QString *)0x95874f);
      this_00 = QDebug::operator<<(in_stack_fffffffffffffec8,(char *)pQVar6);
      (**(code **)(*in_RDX + 0x78))();
      qAccessibleRoleString(in_stack_fffffffffffffeac);
      QDebug::operator<<(this_00,(char *)pQVar6);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                         (char)(in_stack_fffffffffffffeac >> 0x18));
      iVar2 = (**(code **)(*in_RDX + 0x50))();
      if (iVar2 != 0) {
        in_stack_fffffffffffffeb8 =
             (QListSpecialMethods<QString> *)QDebug::operator<<(this_00,(char *)pQVar6);
        (**(code **)(*in_RDX + 0x50))();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,
                           (char)(in_stack_fffffffffffffeac >> 0x18));
      }
      lVar4 = (**(code **)(*in_RDX + 0x18))();
      if (lVar4 != 0) {
        o = QDebug::operator<<(this_00,(char *)pQVar6);
        QDebug::QDebug(&local_40,o);
        (**(code **)(*in_RDX + 0x18))();
        operator<<((Stream *)&local_38,(QObject *)&local_40);
        QDebug::~QDebug(&local_38);
        QDebug::~QDebug(&local_40);
      }
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffeb0 = (QList<QString> *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x95887d);
      local_10 = in_stack_fffffffffffffeb0;
      uVar5 = (**(code **)(*in_RDX + 0x80))();
      local_10._0_5_ = (undefined5)uVar5;
      if (((uint)uVar5 >> 2 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)this_00,(size_t)this);
        QList<QString>::operator<<
                  (in_stack_fffffffffffffeb0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QString::~QString((QString *)0x9588ff);
      }
      if (((uint)local_10 >> 3 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)this_00,(size_t)this);
        QList<QString>::operator<<
                  (in_stack_fffffffffffffeb0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QString::~QString((QString *)0x95894f);
      }
      if (((uint)local_10 >> 1 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)this_00,(size_t)this);
        QList<QString>::operator<<
                  (in_stack_fffffffffffffeb0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QString::~QString((QString *)0x95899e);
      }
      if (((uint)local_10 >> 0x11 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)this_00,(size_t)this);
        QList<QString>::operator<<
                  (in_stack_fffffffffffffeb0,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        QString::~QString((QString *)0x9589ee);
      }
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x9589fb);
      if (!bVar1) {
        QChar::QChar<char16_t,_true>(local_d2,L'|');
        QListSpecialMethods<QString>::join
                  (in_stack_fffffffffffffeb8,(QChar)(char16_t)((ulong)this_00 >> 0x30));
        QDebug::operator<<(this,(QString *)in_stack_fffffffffffffeb8);
        QString::~QString((QString *)0x958a4d);
      }
      if (((uint)local_10 >> 0x11 & 1) == 0) {
        pQVar6 = QDebug::operator<<(this_00,(char *)pQVar6);
        QDebug::QDebug(&local_e8,pQVar6);
        (**(code **)(*in_RDX + 0x70))();
        operator<<((Stream *)&local_e0,(QRect *)&local_e8);
        QDebug::~QDebug(&local_e0);
        QDebug::~QDebug(&local_e8);
      }
      QList<QString>::~QList((QList<QString> *)0x958aca);
    }
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffeb0,(char)(in_stack_fffffffffffffeac >> 0x18)
                      );
    QDebug::QDebug((QDebug *)in_stack_fffffffffffffeb0,
                   (QDebug *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug d, const QAccessibleInterface *iface)
{
    QDebugStateSaver saver(d);
    if (!iface) {
        d << "QAccessibleInterface(null)";
        return d;
    }
    d.nospace();
    d << "QAccessibleInterface(" << Qt::hex << (const void *) iface << Qt::dec;
    if (iface->isValid()) {
        d << " name=" << iface->text(QAccessible::Name) << ' ';
        d << "role=" << qAccessibleRoleString(iface->role()) << ' ';
        if (iface->childCount())
            d << "childc=" << iface->childCount() << ' ';
        if (iface->object()) {
            d << "obj=" << iface->object();
        }
        QStringList stateStrings;
        QAccessible::State st = iface->state();
        if (st.focusable)
            stateStrings << u"focusable"_s;
        if (st.focused)
            stateStrings << u"focused"_s;
        if (st.selected)
            stateStrings << u"selected"_s;
        if (st.invisible)
            stateStrings << u"invisible"_s;

        if (!stateStrings.isEmpty())
            d << stateStrings.join(u'|');

        if (!st.invisible)
            d << "rect=" << iface->rect();

    } else {
        d << " invalid";
    }
    d << ')';
    return d;
}